

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpklite.cc
# Opt level: O0

int explode::unpklite::accept(int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  uint16_t uVar1;
  ulong uVar2;
  undefined4 in_register_0000003c;
  bool local_1d;
  uint16_t local_1c;
  uint16_t local_1a;
  input *piStack_18;
  anon_union_4_2_f8194b7f u;
  input *m_file;
  input_exe_file *inp_local;
  
  m_file = (input *)CONCAT44(in_register_0000003c,__fd);
  piStack_18 = input_exe_file::file((input_exe_file *)m_file);
  (*piStack_18->_vptr_input[5])(piStack_18,0x1e);
  (*piStack_18->_vptr_input[2])(piStack_18,&local_1c,4);
  local_1c = byte_order::from_little_endian(local_1c);
  uVar1 = byte_order::from_little_endian(local_1a);
  uVar2 = 0;
  if (local_1c == 0x4b50) {
    uVar2 = (ulong)(uVar1 & 0xff00);
  }
  local_1d = local_1c == 0x4b50 && uVar1 == 0x494c;
  return (int)CONCAT71((int7)(uVar2 >> 8),local_1d);
}

Assistant:

bool unpklite::accept(input_exe_file& inp)
	{
		input& m_file = inp.file();
		static const offset_type pklite_ver_offset = 2 * 0xF;
		m_file.seek(pklite_ver_offset);

		union
		{
			char     bytes[4];
			uint16_t words[2];
		} u;

		m_file.read_buff(u.bytes, 2 * sizeof(uint16_t));

		u.words[0] = byte_order::from_little_endian(u.words[0]);
		u.words[1] = byte_order::from_little_endian(u.words[1]);

		return (u.words[0] == 0x4B50) && (u.words[1] == 0x494C);
	}